

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void legendre_poly_coef(int n,double *c)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  double *c_local;
  int n_local;
  
  if (-1 < n) {
    for (local_1c = 0; local_1c <= n; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 <= n; local_20 = local_20 + 1) {
        c[local_1c + local_20 * (n + 1)] = 0.0;
      }
    }
    *c = 1.0;
    if (0 < n) {
      c[n + 2] = 1.0;
      for (local_1c = 2; local_1c <= n; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 <= local_1c + -2; local_20 = local_20 + 1) {
          c[local_1c + local_20 * (n + 1)] =
               ((double)(1 - local_1c) * c[local_1c + -2 + local_20 * (n + 1)]) / (double)local_1c;
        }
        for (local_20 = 1; local_20 <= local_1c; local_20 = local_20 + 1) {
          c[local_1c + local_20 * (n + 1)] =
               c[local_1c + local_20 * (n + 1)] +
               ((double)(local_1c * 2 + -1) * c[local_1c + -1 + (local_20 + -1) * (n + 1)]) /
               (double)local_1c;
        }
      }
    }
  }
  return;
}

Assistant:

void legendre_poly_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_POLY_COEF evaluates the Legendre polynomial coefficients.
//
//  First terms:
//
//     1
//     0     1
//    -1/2   0      3/2
//     0    -3/2    0     5/2
//     3/8   0    -30/8   0     35/8
//     0    15/8    0   -70/8    0     63/8
//    -5/16  0    105/16  0   -315/16   0    231/16
//     0   -35/16   0   315/16   0   -693/16   0    429/16
//
//     1.00000
//     0.00000  1.00000
//    -0.50000  0.00000  1.50000
//     0.00000 -1.50000  0.00000  2.5000
//     0.37500  0.00000 -3.75000  0.00000  4.37500
//     0.00000  1.87500  0.00000 -8.75000  0.00000  7.87500
//    -0.31250  0.00000  6.56250  0.00000 -19.6875  0.00000  14.4375
//     0.00000 -2.1875   0.00000  19.6875  0.00000 -43.3215  0.00000  26.8125
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to evaluate.
//    Note that polynomials 0 through N will be evaluated.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Legendre polynomials
//    of degree 0 through N.  Each polynomial is stored as a row.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  c[0+0*(n+1)] = 1.0;

  if ( n <= 0 )
  {
    return;
  }

  c[1+1*(n+1)] = 1.0;

  for ( i = 2; i <= n; i++ )
  {
    for ( j = 0; j <= i-2; j++ )
    {
      c[i+j*(n+1)] =          
          double(   - i + 1 ) * c[i-2+j*(n+1)] / double(i);
    }
    for ( j = 1; j <= i; j++ )
    {
      c[i+j*(n+1)] = c[i+j*(n+1)] 
        + double( i + i - 1 ) * c[i-1+(j-1)*(n+1)] / double(i);
    }
  }

  return;
}